

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int attrset_read_attr_set_v1(BigAttrSet *attrset,char *basename)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  char *__ptr;
  char *pcVar6;
  size_t __size;
  char *attrname;
  undefined1 auStack_68 [8];
  char local_60 [2];
  char local_5e [6];
  char ndtype [8];
  char dtype [9];
  int local_3c;
  int local_38;
  int nmemb;
  int lname;
  
  attrset->dirty = 0;
  iVar4 = 0;
  __stream = (FILE *)_big_file_open_a_file(basename,-2,"r",0);
  if (__stream != (FILE *)0x0) {
    ndtype[0] = '\0';
    ndtype[1] = '\0';
    ndtype[2] = '\0';
    ndtype[3] = '\0';
    ndtype[4] = '\0';
    ndtype[5] = '\0';
    ndtype[6] = '\0';
    ndtype[7] = '\0';
    pcVar6 = auStack_68;
    do {
      iVar4 = 0;
      pcVar6[-8] = -0x73;
      pcVar6[-7] = '9';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar3 = feof(__stream);
      if (iVar3 != 0) goto LAB_00103b1f;
      pcVar6[-8] = -0x55;
      pcVar6[-7] = '9';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(&local_3c,4,1,__stream);
      if (sVar5 != 1) goto LAB_00103b1f;
      pcVar6[-8] = -0x35;
      pcVar6[-7] = '9';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(&local_38,4,1,__stream);
      if (sVar5 != 1) {
LAB_00103b00:
        builtin_strncpy(pcVar6 + -8,"\x1a;\x10",4);
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        _big_file_raise("Failed to read from file",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x5b0);
        iVar4 = -1;
        goto LAB_00103b1f;
      }
      pcVar6[-8] = -0x16;
      pcVar6[-7] = '9';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(ndtype,8,1,__stream);
      if (sVar5 != 1) goto LAB_00103b00;
      pcVar6[-8] = -4;
      pcVar6[-7] = '9';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar4 = dtype_isvalid(ndtype);
      if (iVar4 == 0) goto LAB_00103b00;
      builtin_strncpy(pcVar6 + -8,"\x10:\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      _dtype_normalize(local_60,ndtype);
      builtin_strncpy(pcVar6 + -8,"\x19:\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar4 = atoi(local_5e);
      nmemb = local_3c;
      iVar4 = iVar4 * local_3c;
      lVar1 = -((long)iVar4 + 0xfU & 0xfffffffffffffff0);
      __ptr = pcVar6 + lVar1;
      __size = (size_t)local_38;
      lVar2 = -(__size + 0x10 & 0xfffffffffffffff0);
      attrname = __ptr + lVar2;
      builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"_:\x10",4);
      attrname[-4] = '\0';
      attrname[-3] = '\0';
      attrname[-2] = '\0';
      attrname[-1] = '\0';
      sVar5 = fread(attrname,__size,1,__stream);
      if (sVar5 == 1) {
        builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"x:\x10",4);
        attrname[-4] = '\0';
        attrname[-3] = '\0';
        attrname[-2] = '\0';
        attrname[-1] = '\0';
        sVar5 = fread(__ptr,(long)iVar4,1,__stream);
        if (sVar5 != 1) goto LAB_00103abe;
        attrname[__size] = '\0';
        iVar4 = nmemb;
        attrname[-8] = -0x62;
        attrname[-7] = ':';
        attrname[-6] = '\x10';
        attrname[-5] = '\0';
        attrname[-4] = '\0';
        attrname[-3] = '\0';
        attrname[-2] = '\0';
        attrname[-1] = '\0';
        iVar4 = attrset_set_attr(attrset,attrname,__ptr,ndtype,iVar4);
        if (iVar4 == 0) {
          iVar3 = 0;
        }
        else {
          attrname[-8] = -0x49;
          attrname[-7] = ':';
          attrname[-6] = '\x10';
          attrname[-5] = '\0';
          attrname[-4] = '\0';
          attrname[-3] = '\0';
          attrname[-2] = '\0';
          attrname[-1] = '\0';
          _big_file_raise((char *)0x0,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x5bd);
          iVar3 = 5;
        }
      }
      else {
LAB_00103abe:
        attrname[-8] = -0x28;
        attrname[-7] = ':';
        attrname[-6] = '\x10';
        attrname[-5] = '\0';
        attrname[-4] = '\0';
        attrname[-3] = '\0';
        attrname[-2] = '\0';
        attrname[-1] = '\0';
        _big_file_raise("Failed to read from file",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x5b8);
        iVar3 = 4;
      }
      pcVar6 = attrname;
    } while (iVar3 == 0);
    iVar4 = -1;
    if (iVar3 - 4U < 2) {
LAB_00103b1f:
      attrset->dirty = 0;
      builtin_strncpy(pcVar6 + -8,"1;\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      fclose(__stream);
    }
  }
  return iVar4;
}

Assistant:

static int
attrset_read_attr_set_v1(BigAttrSet * attrset, const char * basename)
{
    attrset->dirty = 0;

    FILE * fattr = _big_file_open_a_file(basename, FILEID_ATTR, "r", 0);
    if(fattr == NULL) {
        return 0;
    }
    int nmemb;
    int lname;
    char dtype[9]={0};
    char * data;
    char * name;
    while(!feof(fattr)) {
        if(1 != fread(&nmemb, sizeof(int), 1, fattr)) break;
        RAISEIF(
            (1 != fread(&lname, sizeof(int), 1, fattr)) ||
            (1 != fread(&dtype, 8, 1, fattr)) ||
            (!dtype_isvalid(dtype)),
            ex_fread,
            "Failed to read from file"
                )
        int ldata = big_file_dtype_itemsize(dtype) * nmemb;
        data = alloca(ldata);
        name = alloca(lname + 1);
        RAISEIF(
            (1 != fread(name, lname, 1, fattr)) ||
            (1 != fread(data, ldata, 1, fattr)),
            ex_fread,
            "Failed to read from file");

        name[lname] = 0;
        RAISEIF(0 != attrset_set_attr(attrset, name, data, dtype, nmemb),
            ex_set_attr,
            NULL);
    }
    attrset->dirty = 0;
    fclose(fattr);
    return 0;
ex_set_attr:
ex_fread:
    attrset->dirty = 0;
    fclose(fattr);
    return -1;
}